

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaMultiGenerator::OpenBuildFileStreams(cmGlobalNinjaMultiGenerator *this)

{
  char *pcVar1;
  bool bVar2;
  type pcVar3;
  ostream *poVar4;
  reference this_00;
  pointer this_01;
  const_iterator __first;
  const_iterator __last;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmGlobalNinjaMultiGenerator *local_18;
  cmGlobalNinjaMultiGenerator *this_local;
  
  pcVar1 = NINJA_COMMON_FILE;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_39);
  bVar2 = cmGlobalNinjaGenerator::OpenFileStream
                    (&this->super_cmGlobalNinjaGenerator,&this->CommonFileStream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = cmGlobalNinjaGenerator::NINJA_BUILD_FILE;
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar1,&local_71);
    bVar2 = cmGlobalNinjaGenerator::OpenFileStream
                      (&this->super_cmGlobalNinjaGenerator,&this->DefaultFileStream,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->DefaultFileStream);
      poVar4 = std::operator<<((ostream *)pcVar3,"# Build using rules for \'");
      config = &(this->super_cmGlobalNinjaGenerator).DefaultFileConfig;
      poVar4 = std::operator<<(poVar4,(string *)config);
      poVar4 = std::operator<<(poVar4,"\'.\n\n");
      poVar4 = std::operator<<(poVar4,"include ");
      GetNinjaImplFilename((string *)&configs,config);
      poVar4 = std::operator<<(poVar4,(string *)&configs);
      std::operator<<(poVar4,"\n\n");
      std::__cxx11::string::~string((string *)&configs);
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->CommonFileStream);
      std::operator<<((ostream *)pcVar3,
                      "# This file contains build statements common to all configurations.\n\n");
      this_00 = std::
                vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ::operator[](&(this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
                              super_cmGlobalGenerator.Makefiles,0);
      this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
      cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_b8,this_01,IncludeEmptyConfig);
      local_a0 = &local_b8;
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&local_b8);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_a0);
      this_local._7_1_ =
           std::
           all_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0>
                     ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )__first._M_current,
                      (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )__last._M_current,(anon_class_8_1_8991fb9c)this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->CommonFileStream,
                            cmGlobalNinjaMultiGenerator::NINJA_COMMON_FILE)) {
    return false;
  }

  if (!this->OpenFileStream(this->DefaultFileStream, NINJA_BUILD_FILE)) {
    return false;
  }
  *this->DefaultFileStream << "# Build using rules for '"
                           << this->DefaultFileConfig << "'.\n\n"
                           << "include "
                           << GetNinjaImplFilename(this->DefaultFileConfig)
                           << "\n\n";

  // Write a comment about this file.
  *this->CommonFileStream
    << "# This file contains build statements common to all "
       "configurations.\n\n";

  auto const& configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  return std::all_of(
    configs.begin(), configs.end(), [this](std::string const& config) -> bool {
      // Open impl file.
      if (!this->OpenFileStream(this->ImplFileStreams[config],
                                GetNinjaImplFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ImplFileStreams[config]
        << "# This file contains build statements specific to the \"" << config
        << "\"\n# configuration.\n\n";

      // Open config file.
      if (!this->OpenFileStream(this->ConfigFileStreams[config],
                                GetNinjaConfigFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ConfigFileStreams[config]
        << "# This file contains aliases specific to the \"" << config
        << "\"\n# configuration.\n\n"
        << "include " << GetNinjaImplFilename(config) << "\n\n";

      return true;
    });
}